

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitions.c
# Opt level: O1

size_t inform_next_partitioning(size_t *xs,size_t size)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t sVar10;
  bool bVar11;
  
  if (1 < size) {
    lVar1 = size * 8;
    lVar8 = lVar1 + -8;
    if (lVar8 != 0) {
      lVar7 = 0;
      uVar9 = 0;
      lVar6 = lVar1;
      do {
        uVar2 = *(ulong *)((long)xs + lVar8);
        if (uVar2 < size - 1) {
          lVar5 = lVar6;
          if (*(ulong *)(lVar6 + -0x10 + (long)xs) == uVar2) {
            bVar11 = false;
          }
          else {
            do {
              bVar11 = lVar5 == 0x10;
              if (bVar11) goto LAB_00109f78;
              lVar3 = lVar5 + -0x18;
              lVar5 = lVar5 + -8;
            } while (*(ulong *)((long)xs + lVar3) != uVar2);
          }
          *(ulong *)((long)xs + lVar8) = uVar2 + 1;
          if (lVar6 != lVar1) {
            memset((void *)((long)xs + lVar6),0,lVar7 * 8);
          }
          sVar4 = 0;
          sVar10 = uVar9;
          do {
            uVar9 = xs[sVar4] + 1;
            if (xs[sVar4] + 1 <= sVar10) {
              uVar9 = sVar10;
            }
            sVar4 = sVar4 + 1;
            sVar10 = uVar9;
          } while (size != sVar4);
LAB_00109f78:
          if (!bVar11) {
            return uVar9;
          }
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + -8;
        lVar8 = lVar8 + -8;
        if (lVar8 == 0) {
          return uVar9;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

size_t inform_next_partitioning(size_t *xs, size_t size)
{
    size_t n = 0;
    if (size > 1)
    {
        size_t *first = xs;
        size_t *last  = first + size;
        for (size_t *it = last - 1; it != first; --it)
        {
            if (*it < size - 1)
            {
                for (size_t *jt = it - 1; jt != first - 1; --jt)
                {
                    if (*jt == *it)
                    {
                        *it += 1;
                        for (size_t *kt = it + 1; kt != last; ++kt)
                        {
                            *kt = 0;
                        }
                        for (size_t i = 0; i < size; ++i)
                        {
                            n = (xs[i]+1 > n) ? xs[i]+1 : n;
                        }
                        return n;
                    }
                }
            }
        }
    }
    return n;
}